

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

JSONNode __thiscall JSONNode::pop_back(JSONNode *this,json_string *name_t)

{
  out_of_range *this_00;
  string *psVar1;
  json_string *in_RDX;
  auto_delete local_30;
  auto_delete temp;
  JSONNode *res;
  json_string *name_t_local;
  JSONNode *this_local;
  
  temp.mynode = internalJSONNode::pop_back(*(internalJSONNode **)name_t,in_RDX);
  if (temp.mynode != (JSONNode *)0x0) {
    auto_delete::auto_delete(&local_30,temp.mynode);
    JSONNode(this,local_30.mynode);
    auto_delete::~auto_delete(&local_30);
    return (JSONNode)(internalJSONNode *)this;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  psVar1 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::out_of_range::out_of_range(this_00,(string *)psVar1);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

json_throws(std::out_of_range) {
    JSON_CHECK_INTERNAL();
    JSON_ASSERT(type() == JSON_NODE, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("pop_back"));
    #ifdef JSON_LIBRARY
	   return internal -> pop_back(name_t);
    #else
	   if (JSONNode * res = internal -> pop_back(name_t)){
		  auto_delete temp(res);
		  return *(temp.mynode);
	   }
	   JSON_FAIL(json_string(JSON_TEXT("pop_back const could not find child by name: ")) + name_t);
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    #endif
}